

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

vec<float,_4> linalg::slerp<float,4>(vec<float,_4> *a,vec<float,_4> *b,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  vec<float,_4> vVar9;
  
  fVar4 = uangle<float,4>(a,b);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar6 = sinf((1.0 - t) * fVar4);
    fVar5 = sinf(fVar4);
    fVar6 = fVar6 / fVar5;
    fVar5 = a->x;
    fVar1 = a->y;
    fVar2 = a->z;
    fVar3 = a->w;
    fVar7 = sinf(fVar4 * t);
    fVar4 = sinf(fVar4);
    fVar7 = fVar7 / fVar4;
    fVar4 = b->x * fVar7 + fVar5 * fVar6;
    fVar5 = b->y * fVar7 + fVar1 * fVar6;
    uVar8 = CONCAT44(fVar7 * b->w + fVar6 * fVar3,b->z * fVar7 + fVar2 * fVar6);
  }
  else {
    fVar4 = a->x;
    fVar5 = a->y;
    uVar8._0_4_ = a->z;
    uVar8._4_4_ = a->w;
  }
  vVar9.y = fVar5;
  vVar9.x = fVar4;
  vVar9.z = (float)(int)uVar8;
  vVar9.w = (float)(int)((ulong)uVar8 >> 0x20);
  return vVar9;
}

Assistant:

vec<T,M>    slerp    (const vec<T,M> & a, const vec<T,M> & b, T t) { T th=uangle(a,b); return th == 0 ? a : a*(std::sin(th*(1-t))/std::sin(th)) + b*(std::sin(th*t)/std::sin(th)); }